

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.cpp
# Opt level: O0

Matrix4x4 * CMU462::operator*(Matrix4x4 *__return_storage_ptr__,double c,Matrix4x4 *A)

{
  double *cAij;
  double *Aij;
  Matrix4x4 *A_local;
  double c_local;
  Matrix4x4 *cA;
  
  Matrix4x4::Matrix4x4(__return_storage_ptr__);
  __return_storage_ptr__->entries[0].x = c * A->entries[0].x;
  __return_storage_ptr__->entries[0].y = c * A->entries[0].y;
  __return_storage_ptr__->entries[0].z = c * A->entries[0].z;
  __return_storage_ptr__->entries[0].w = c * A->entries[0].w;
  __return_storage_ptr__->entries[1].x = c * A->entries[1].x;
  __return_storage_ptr__->entries[1].y = c * A->entries[1].y;
  __return_storage_ptr__->entries[1].z = c * A->entries[1].z;
  __return_storage_ptr__->entries[1].w = c * A->entries[1].w;
  __return_storage_ptr__->entries[2].x = c * A->entries[2].x;
  __return_storage_ptr__->entries[2].y = c * A->entries[2].y;
  __return_storage_ptr__->entries[2].z = c * A->entries[2].z;
  __return_storage_ptr__->entries[2].w = c * A->entries[2].w;
  __return_storage_ptr__->entries[3].x = c * A->entries[3].x;
  __return_storage_ptr__->entries[3].y = c * A->entries[3].y;
  __return_storage_ptr__->entries[3].z = c * A->entries[3].z;
  __return_storage_ptr__->entries[3].w = c * A->entries[3].w;
  return __return_storage_ptr__;
}

Assistant:

Matrix4x4 operator*( double c, const Matrix4x4& A ) {

    Matrix4x4 cA;
    const double* Aij = (const double*) &A;
    double* cAij = (double*) &cA;

    *cAij++ = c * (*Aij++);//0
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);//4
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);//8
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);//12
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);//15
	//16
    return cA;
  }